

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O0

void apx_server_trigger_connected_event
               (apx_server_t *self,apx_serverConnection_t *server_connection)

{
  _func_void_void_ptr_apx_serverConnection_tag_ptr *p_Var1;
  apx_serverEventListener_t *listener;
  adt_list_elem_t *iter;
  apx_serverConnection_t *server_connection_local;
  apx_server_t *self_local;
  
  if (self == (apx_server_t *)0x0) {
    __assert_fail("self != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/server.c"
                  ,0x228,
                  "void apx_server_trigger_connected_event(apx_server_t *, apx_serverConnection_t *)"
                 );
  }
  if (server_connection != (apx_serverConnection_t *)0x0) {
    pthread_mutex_lock((pthread_mutex_t *)&self->event_listener_lock);
    for (listener = (apx_serverEventListener_t *)adt_list_iter_first(&self->server_event_listeners);
        listener != (apx_serverEventListener_t *)0x0;
        listener = (apx_serverEventListener_t *)adt_list_iter_next((adt_list_elem_t *)listener)) {
      p_Var1 = listener->serverDisconnect1;
      if ((p_Var1 != (_func_void_void_ptr_apx_serverConnection_tag_ptr *)0x0) &&
         (*(long *)(p_Var1 + 8) != 0)) {
        (**(code **)(p_Var1 + 8))(*(undefined8 *)p_Var1,server_connection);
      }
    }
    pthread_mutex_unlock((pthread_mutex_t *)&self->event_listener_lock);
    return;
  }
  __assert_fail("server_connection != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/server.c"
                ,0x229,
                "void apx_server_trigger_connected_event(apx_server_t *, apx_serverConnection_t *)")
  ;
}

Assistant:

static void apx_server_trigger_connected_event(apx_server_t* self, apx_serverConnection_t* server_connection)
{
   assert(self != NULL);
   assert(server_connection != NULL);
   MUTEX_LOCK(self->event_listener_lock);
   adt_list_elem_t *iter = adt_list_iter_first(&self->server_event_listeners);
   while(iter != 0)
   {
      apx_serverEventListener_t *listener = (apx_serverEventListener_t*) iter->pItem;
      if ( (listener != 0) && (listener->serverConnect1 != NULL) )
      {
         listener->serverConnect1(listener->arg, server_connection);
      }
      iter = adt_list_iter_next(iter);
   }
   MUTEX_UNLOCK(self->event_listener_lock);
}